

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasquadtree.cpp
# Opt level: O2

U32 __thiscall
LASquadtree::intersect_circle(LASquadtree *this,F64 center_x,F64 center_y,F64 radius,U32 level)

{
  float cell_min_x;
  float cell_max_x;
  float cell_min_y;
  float cell_max_y;
  long *plVar1;
  double r_min_x;
  U32 UVar2;
  undefined8 *puVar3;
  double r_min_y;
  double r_max_x;
  double r_max_y;
  
  plVar1 = (long *)this->current_cells;
  if (plVar1 == (long *)0x0) {
    puVar3 = (undefined8 *)operator_new(0x18);
    *puVar3 = 0;
    puVar3[1] = 0;
    puVar3[2] = 0;
    this->current_cells = puVar3;
  }
  else if (plVar1[1] != *plVar1) {
    plVar1[1] = *plVar1;
  }
  r_max_x = (double)center_x + (double)radius;
  cell_min_x = (float)this->min_x;
  UVar2 = 0;
  if ((double)cell_min_x < r_max_x) {
    r_min_x = (double)center_x - (double)radius;
    cell_max_x = (float)this->max_x;
    if (r_min_x <= (double)cell_max_x) {
      r_max_y = (double)center_y + (double)radius;
      cell_min_y = (float)this->min_y;
      if ((double)cell_min_y < r_max_y) {
        r_min_y = (double)center_y - (double)radius;
        cell_max_y = (float)this->max_y;
        if (r_min_y <= (double)cell_max_y) {
          if (this->adaptive == (U32 *)0x0) {
            intersect_circle_with_cells
                      (this,center_x,center_y,radius,(F64)r_min_x,(F64)r_min_y,(F64)r_max_x,
                       (F64)r_max_y,(F32)cell_min_x,(F32)cell_max_x,(F32)cell_min_y,(F32)cell_max_y,
                       level,0);
          }
          else {
            intersect_circle_with_cells_adaptive
                      (this,center_x,center_y,radius,(F64)r_min_x,(F64)r_min_y,(F64)r_max_x,
                       (F64)r_max_y,(F32)cell_min_x,(F32)cell_max_x,(F32)cell_min_y,(F32)cell_max_y,
                       0,0);
          }
          UVar2 = (U32)((ulong)(*(long *)((long)this->current_cells + 8) - *this->current_cells) >>
                       2);
        }
      }
    }
  }
  return UVar2;
}

Assistant:

U32 LASquadtree::intersect_circle(const F64 center_x, const F64 center_y, const F64 radius, U32 level)
{
  if (current_cells == 0)
  {
    current_cells = (void*) new my_cell_vector;
  }
  else
  {
    ((my_cell_vector*)current_cells)->clear();
  }

  F64 r_min_x = center_x - radius; 
  F64 r_min_y = center_y - radius; 
  F64 r_max_x = center_x + radius;
  F64 r_max_y = center_y + radius;

  if (r_max_x <= min_x || !(r_min_x <= max_x) || r_max_y <= min_y || !(r_min_y <= max_y))
  {
    return 0;
  }

  if (adaptive)
  {
    intersect_circle_with_cells_adaptive(center_x, center_y, radius, r_min_x, r_min_y, r_max_x, r_max_y, min_x, max_x, min_y, max_y, 0, 0);
  }
  else
  {
    intersect_circle_with_cells(center_x, center_y, radius, r_min_x, r_min_y, r_max_x, r_max_y, min_x, max_x, min_y, max_y, level, 0);
  }

  return (U32)(((my_cell_vector*)current_cells)->size());
}